

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Clear(CodeGeneratorResponse *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  CodeGeneratorResponse *this_local;
  
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::Clear(&this->file_);
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->error_);
  }
  this->supported_features_ = 0;
  internal::HasBits<1UL>::Clear(&this->_has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  file_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    error_.ClearNonDefaultToEmpty();
  }
  supported_features_ = uint64_t{0u};
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}